

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_parse.c
# Opt level: O0

MPP_RET parse_mastering_display_and_content_meta
                  (BitReadCtx_t *bitctx,MppFrameMasteringDisplayMetadata *display_meta,
                  MppFrameContentLightMetadata *content_light)

{
  MPP_RET MVar1;
  MppFrameContentLightMetadata MVar2;
  MppFrameContentLightMetadata MVar3;
  char local_94 [7];
  char local_8d;
  RK_S32 _out_15;
  char acStack_88 [3];
  RK_U8 bval_7;
  RK_S32 _out_14;
  RK_S32 _out_13;
  char acStack_7c [3];
  RK_U8 bval_6;
  RK_S32 _out_12;
  RK_S32 _out_11;
  char acStack_70 [3];
  RK_U8 bval_5;
  RK_S32 _out_10;
  RK_S32 _out_9;
  char acStack_64 [3];
  RK_U8 bval_4;
  RK_S32 _out_8;
  RK_S32 _out_7;
  char acStack_58 [3];
  RK_U8 bval_3;
  RK_S32 _out_6;
  RK_S32 _out_5;
  RK_S32 RStack_4c;
  RK_U8 bval_2;
  RK_S32 _out_4;
  RK_S32 _out_3;
  RK_S32 RStack_40;
  RK_U8 bval_1;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_U16 RStack_32;
  RK_U8 bval;
  RK_S32 _out;
  MPP_RET MStack_2c;
  RK_U16 value;
  RK_U32 i;
  MPP_RET ret;
  MppFrameContentLightMetadata *content_light_local;
  MppFrameMasteringDisplayMetadata *display_meta_local;
  BitReadCtx_t *bitctx_local;
  
  MStack_2c = MPP_OK;
  _out = 0;
  _i = content_light;
  content_light_local = (MppFrameContentLightMetadata *)display_meta;
  display_meta_local = (MppFrameMasteringDisplayMetadata *)bitctx;
  while( true ) {
    if (2 < (uint)_out) break;
    MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,0x10,&_out_1);
    display_meta_local[2].min_luminance = MVar1;
    if (display_meta_local[2].min_luminance != 0) goto LAB_001ad003;
    RStack_32 = (RK_U16)_out_1;
    MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,1,&stack0xffffffffffffffc0);
    display_meta_local[2].min_luminance = MVar1;
    if (display_meta_local[2].min_luminance != 0) goto LAB_001ad003;
    _out_2._3_1_ = (char)RStack_40;
    if ((_out_2._3_1_ != '\x01') && ((avs2d_parse_debug & 4) != 0)) {
      _mpp_log_l(4,"avs2d_parse","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,0xf2);
    }
    content_light_local[(uint)_out].MaxCLL = RStack_32;
    MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,0x10,&_out_3);
    display_meta_local[2].min_luminance = MVar1;
    if (display_meta_local[2].min_luminance != 0) goto LAB_001ad003;
    RStack_32 = (RK_U16)_out_3;
    MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,1,&stack0xffffffffffffffb4);
    display_meta_local[2].min_luminance = MVar1;
    if (display_meta_local[2].min_luminance != 0) goto LAB_001ad003;
    _out_4._3_1_ = (char)RStack_4c;
    if ((_out_4._3_1_ != '\x01') && ((avs2d_parse_debug & 4) != 0)) {
      _mpp_log_l(4,"avs2d_parse","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,0xf5);
    }
    content_light_local[(uint)_out].MaxFALL = RStack_32;
    _out = _out + 1;
  }
  MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,0x10,&_out_5);
  display_meta_local[2].min_luminance = MVar1;
  if (display_meta_local[2].min_luminance == 0) {
    RStack_32 = (RK_U16)_out_5;
    MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,1,(RK_S32 *)acStack_58);
    display_meta_local[2].min_luminance = MVar1;
    if (display_meta_local[2].min_luminance == 0) {
      _out_6._3_1_ = acStack_58[0];
      if ((acStack_58[0] != '\x01') && ((avs2d_parse_debug & 4) != 0)) {
        _mpp_log_l(4,"avs2d_parse","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,0xf9)
        ;
      }
      content_light_local[3].MaxCLL = RStack_32;
      MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,0x10,&_out_7);
      display_meta_local[2].min_luminance = MVar1;
      if (display_meta_local[2].min_luminance == 0) {
        RStack_32 = (RK_U16)_out_7;
        MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,1,(RK_S32 *)acStack_64);
        display_meta_local[2].min_luminance = MVar1;
        if (display_meta_local[2].min_luminance == 0) {
          _out_8._3_1_ = acStack_64[0];
          if ((acStack_64[0] != '\x01') && ((avs2d_parse_debug & 4) != 0)) {
            _mpp_log_l(4,"avs2d_parse","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,
                       0xfc);
          }
          content_light_local[3].MaxFALL = RStack_32;
          MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,0x10,&_out_9);
          display_meta_local[2].min_luminance = MVar1;
          if (display_meta_local[2].min_luminance == 0) {
            RStack_32 = (ushort)_out_9;
            MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,1,(RK_S32 *)acStack_70);
            display_meta_local[2].min_luminance = MVar1;
            if (display_meta_local[2].min_luminance == 0) {
              _out_10._3_1_ = acStack_70[0];
              if ((acStack_70[0] != '\x01') && ((avs2d_parse_debug & 4) != 0)) {
                _mpp_log_l(4,"avs2d_parse","expected marker_bit 1 while received 0(%d).\n",
                           (char *)0x0,0xff);
              }
              MVar2.MaxFALL = 0;
              MVar2.MaxCLL = RStack_32;
              content_light_local[4] = MVar2;
              MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,0x10,&_out_11);
              display_meta_local[2].min_luminance = MVar1;
              if (display_meta_local[2].min_luminance == 0) {
                RStack_32 = (ushort)_out_11;
                MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,1,(RK_S32 *)acStack_7c);
                display_meta_local[2].min_luminance = MVar1;
                if (display_meta_local[2].min_luminance == 0) {
                  _out_12._3_1_ = acStack_7c[0];
                  if ((acStack_7c[0] != '\x01') && ((avs2d_parse_debug & 4) != 0)) {
                    _mpp_log_l(4,"avs2d_parse","expected marker_bit 1 while received 0(%d).\n",
                               (char *)0x0,0x102);
                  }
                  MVar3.MaxFALL = 0;
                  MVar3.MaxCLL = RStack_32;
                  content_light_local[5] = MVar3;
                  MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,0x10,&_out_13);
                  display_meta_local[2].min_luminance = MVar1;
                  if (display_meta_local[2].min_luminance == 0) {
                    RStack_32 = (RK_U16)_out_13;
                    MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,1,(RK_S32 *)acStack_88)
                    ;
                    display_meta_local[2].min_luminance = MVar1;
                    if (display_meta_local[2].min_luminance == 0) {
                      _out_14._3_1_ = acStack_88[0];
                      if ((acStack_88[0] != '\x01') && ((avs2d_parse_debug & 4) != 0)) {
                        _mpp_log_l(4,"avs2d_parse","expected marker_bit 1 while received 0(%d).\n",
                                   (char *)0x0,0x107);
                      }
                      _i->MaxCLL = RStack_32;
                      MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,0x10,&_out_15);
                      display_meta_local[2].min_luminance = MVar1;
                      if (display_meta_local[2].min_luminance == 0) {
                        RStack_32 = (RK_U16)_out_15;
                        MVar1 = mpp_read_bits((BitReadCtx_t *)display_meta_local,1,
                                              (RK_S32 *)local_94);
                        display_meta_local[2].min_luminance = MVar1;
                        if (display_meta_local[2].min_luminance == 0) {
                          local_8d = local_94[0];
                          if ((local_94[0] != '\x01') && ((avs2d_parse_debug & 4) != 0)) {
                            _mpp_log_l(4,"avs2d_parse",
                                       "expected marker_bit 1 while received 0(%d).\n",(char *)0x0,
                                       0x10a);
                          }
                          _i->MaxFALL = RStack_32;
                          MVar1 = mpp_skip_longbits((BitReadCtx_t *)display_meta_local,0x10);
                          display_meta_local[2].min_luminance = MVar1;
                          if (display_meta_local[2].min_luminance == 0) {
                            return MStack_2c;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001ad003:
  return display_meta_local[2].min_luminance;
}

Assistant:

static MPP_RET parse_mastering_display_and_content_meta(BitReadCtx_t *bitctx,
                                                        MppFrameMasteringDisplayMetadata *display_meta,
                                                        MppFrameContentLightMetadata *content_light)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i = 0;
    RK_U16 value;

    /* display metadata */
    for (i = 0; i < 3; i++) {
        READ_BITS(bitctx, 16, &value);
        READ_MARKER_BIT(bitctx);
        display_meta->display_primaries[i][0] = value;
        READ_BITS(bitctx, 16, &value);
        READ_MARKER_BIT(bitctx);
        display_meta->display_primaries[i][1] = value;
    }
    READ_BITS(bitctx, 16, &value);
    READ_MARKER_BIT(bitctx);
    display_meta->white_point[0] = value;
    READ_BITS(bitctx, 16, &value);
    READ_MARKER_BIT(bitctx);
    display_meta->white_point[1] = value;
    READ_BITS(bitctx, 16, &value);
    READ_MARKER_BIT(bitctx);
    display_meta->max_luminance = value;
    READ_BITS(bitctx, 16, &value);
    READ_MARKER_BIT(bitctx);
    display_meta->min_luminance = value;

    /* content light */
    READ_BITS(bitctx, 16, &value);
    READ_MARKER_BIT(bitctx);
    content_light->MaxCLL = value;
    READ_BITS(bitctx, 16, &value);
    READ_MARKER_BIT(bitctx);
    content_light->MaxFALL = value;

    SKIP_BITS(bitctx, 16);

    return ret;
__BITREAD_ERR:
    return ret = bitctx->ret;
}